

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O0

void Ndr_ObjReadConstant(Vec_Int_t *vFanins,char *pStr)

{
  int nSize;
  size_t sVar1;
  uint *p;
  int local_30;
  int local_20;
  int Len;
  int k;
  int i;
  char *pStr_local;
  Vec_Int_t *vFanins_local;
  
  if (pStr == (char *)0x0) {
    local_30 = 0;
  }
  else {
    sVar1 = strlen(pStr);
    local_30 = (int)sVar1;
  }
  for (local_20 = 0; (local_20 < local_30 && (pStr[local_20] != 'b')); local_20 = local_20 + 1) {
  }
  if ((pStr == (char *)0x0) || (pStr[local_20] != 'b')) {
    printf(
          "Constants should be represented in binary Verilog notation <nbits>\'b<bits> as char strings (for example, \"4\'b1010\").\n"
          );
  }
  else {
    nSize = Abc_BitWordNum((local_30 - local_20) + -1);
    Vec_IntFill(vFanins,nSize,0);
    while (Len = local_20 + 1, Len < local_30) {
      local_20 = Len;
      if (pStr[Len] == '1') {
        p = (uint *)Vec_IntArray(vFanins);
        Abc_InfoSetBit(p,(local_30 - Len) + -1);
      }
      else if (pStr[Len] != '0') {
        printf("Wrongn symbol (%c) in binary Verilog constant \"%s\".\n",(ulong)(uint)(int)pStr[Len]
               ,pStr);
      }
    }
  }
  return;
}

Assistant:

void Ndr_ObjReadConstant( Vec_Int_t * vFanins, char * pStr )
{
    int i, k, Len = pStr ? strlen(pStr) : 0;
    for ( k = 0; k < Len; k++ )
        if ( pStr[k] == 'b' )
            break;
    if ( pStr == NULL || pStr[k] != 'b' )
    {
        printf( "Constants should be represented in binary Verilog notation <nbits>\'b<bits> as char strings (for example, \"4'b1010\").\n" );
        return;
    }
    Vec_IntFill( vFanins, Abc_BitWordNum(Len-k-1), 0 );
    for ( i = k+1; i < Len; i++ )
        if ( pStr[i] == '1' )
            Abc_InfoSetBit( (unsigned *)Vec_IntArray(vFanins), Len-i-1 );
        else if ( pStr[i] != '0' )
            printf( "Wrongn symbol (%c) in binary Verilog constant \"%s\".\n", pStr[i], pStr );
}